

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall Diligent::ThreadPoolImpl::~ThreadPoolImpl(ThreadPoolImpl *this)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_RCX) [30];
  undefined1 local_68 [8];
  string msg_1;
  string msg;
  ThreadPoolImpl *this_local;
  memory_order __b;
  
  StopThreads(this);
  bVar1 = std::
          multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
          ::empty(&this->m_TasksQueue);
  if (!bVar1) {
    FormatString<char[26],char[21]>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_TasksQueue.empty()",(char (*) [21])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [30])0x145;
    DebugAssertionFailed
              (pCVar2,"~ThreadPoolImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0x145);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if ((this->m_NumRunningTasks).super___atomic_base<int>._M_i != 0) {
    FormatString<char[26],char[30]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_NumRunningTasks.load() == 0",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~ThreadPoolImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0x146);
    std::__cxx11::string::~string((string *)local_68);
  }
  std::condition_variable::~condition_variable(&this->m_TasksFinishedCond);
  std::condition_variable::~condition_variable(&this->m_NextTaskCond);
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::~vector(&this->m_ReprioritizationList);
  std::
  multimap<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::~multimap(&this->m_TasksQueue);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->m_WorkerThreads);
  ObjectBase<Diligent::IThreadPool>::~ObjectBase(&this->super_ObjectBase<Diligent::IThreadPool>);
  return;
}

Assistant:

~ThreadPoolImpl()
    {
        StopThreads();
        VERIFY_EXPR(m_TasksQueue.empty());
        VERIFY_EXPR(m_NumRunningTasks.load() == 0);
    }